

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O1

int __thiscall
de::BlockBuffer<unsigned_char>::tryRead
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements)

{
  deBool dVar1;
  int iVar2;
  undefined8 *puVar3;
  int iVar4;
  
  if (this->m_canceled != 0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_00150a58;
    __cxa_throw(puVar3,&BufferCanceledException::typeinfo,std::exception::~exception);
  }
  dVar1 = deMutex_tryLock((this->m_readLock).m_mutex);
  iVar4 = 0;
  if (dVar1 == 1) {
    iVar4 = 0;
    do {
      if (numElements - iVar4 == 0 || numElements < iVar4) break;
      iVar2 = readFromCurrentBlock(this,numElements - iVar4,elements + iVar4,false);
      iVar4 = iVar4 + iVar2;
    } while (iVar2 != 0);
    deMutex_unlock((this->m_readLock).m_mutex);
  }
  return iVar4;
}

Assistant:

int BlockBuffer<T>::tryRead (int numElements, T* elements)
{
	int numRead = 0;

	if (m_canceled)
		throw CanceledException();

	if (!m_readLock.tryLock())
		return numRead;

	while (numRead < numElements)
	{
		int ret = readFromCurrentBlock(numElements-numRead, &elements[numRead], false /* non-blocking */);

		if (ret == 0)
			break; /* Failed. */

		numRead += ret;
	}

	m_readLock.unlock();

	return numRead;
}